

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,double arg0)

{
  undefined1 auVar1 [12];
  ulong uVar2;
  ulong uVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  Interval local_48;
  Interval local_30;
  uint uVar10;
  
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xd])(this);
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xf])(this,ctx);
  local_48.m_hasNaN = NAN(extraout_XMM0_Qa);
  local_48.m_hi = extraout_XMM0_Qa;
  if (local_48.m_hasNaN) {
    local_48.m_lo = INFINITY;
    dVar4 = INFINITY;
    if (!local_48.m_hasNaN && !NAN(extraout_XMM0_Qa)) goto LAB_0076cb0a;
  }
  else {
    local_48.m_lo = extraout_XMM0_Qa;
    dVar4 = extraout_XMM0_Qa;
    if (!local_48.m_hasNaN) goto LAB_0076cb0a;
  }
  local_48.m_lo = dVar4;
  local_48.m_hi = -INFINITY;
LAB_0076cb0a:
  local_30.m_hasNaN = NAN(extraout_XMM0_Qa_00);
  uVar10 = (uint)((long)((ulong)(uint)local_30.m_hasNaN << 0x3f) >> 0x3f);
  auVar1._4_8_ = 0;
  auVar1._0_4_ = uVar10;
  auVar8._0_12_ = auVar1 << 0x20;
  auVar8._12_4_ = (int)((long)((ulong)(uint)local_30.m_hasNaN << 0x3f) >> 0x3f);
  auVar11._4_4_ = uVar10;
  auVar11._0_4_ = uVar10;
  auVar11._8_4_ = auVar8._12_4_;
  auVar11._12_4_ = auVar8._12_4_;
  auVar9._8_8_ = -extraout_XMM0_Qa_00;
  auVar9._0_8_ = extraout_XMM0_Qa_00;
  auVar5 = _DAT_009e6260 & auVar8 | ~auVar11 & auVar9;
  auVar9 = auVar8 & _DAT_00a0bd90 | ~auVar11 & auVar9;
  auVar7._0_8_ = auVar9._8_8_;
  auVar7._8_4_ = auVar9._0_4_;
  auVar7._12_4_ = auVar9._4_4_;
  dVar4 = auVar5._0_8_;
  dVar6 = auVar5._8_8_;
  uVar2 = -(ulong)(auVar7._0_8_ <= dVar4);
  uVar3 = -(ulong)(auVar7._8_8_ <= dVar6);
  local_30.m_lo = (double)(~uVar2 & (ulong)dVar4 | (ulong)auVar7._0_8_ & uVar2);
  local_30.m_hi = (double)(~uVar3 & auVar9._0_8_ | (ulong)dVar6 & uVar3);
  tcu::operator+(__return_storage_ptr__,&local_48,&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext& ctx, double arg0) const
	{
		const double	exact	= this->applyExact(arg0);
		const double	prec	= this->precision(ctx, exact, arg0);

		return exact + Interval(-prec, prec);
	}